

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O2

char * icu_63::PropNameData::getPropertyValueName(int32_t property,int32_t value,int32_t nameChoice)

{
  int32_t iVar1;
  char *pcVar2;
  
  iVar1 = findProperty(property);
  if (iVar1 != 0) {
    iVar1 = findPropertyValueNameGroup(*(int32_t *)(valueMaps + (long)iVar1 * 4 + 4),value);
    if (iVar1 != 0) {
      pcVar2 = getName(&nameGroups + iVar1,nameChoice);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

const char *PropNameData::getPropertyValueName(int32_t property, int32_t value, int32_t nameChoice) {
    int32_t valueMapIndex=findProperty(property);
    if(valueMapIndex==0) {
        return NULL;  // Not a known property.
    }
    int32_t nameGroupOffset=findPropertyValueNameGroup(valueMaps[valueMapIndex+1], value);
    if(nameGroupOffset==0) {
        return NULL;
    }
    return getName(nameGroups+nameGroupOffset, nameChoice);
}